

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsVcTotalLevel(uint arg_count,long *arg_array)

{
  long *arg_array_local;
  uint arg_count_local;
  
  if (arg_count < 4) {
    __assert_fail("arg_count >= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x549,"void Macro_smpsVcTotalLevel(unsigned int, long *)");
  }
  vcTL1 = (uint)*arg_array;
  vcTL2 = (uint)arg_array[1];
  vcTL3 = (uint)arg_array[2];
  vcTL4 = (uint)arg_array[3];
  WriteByte((char)(vcUnusedBits << 6) + (char)(vcFeedback << 3) + (char)vcAlgorithm);
  if (target_smps2asm_version == 0) {
    vcTLMask4 = (uint)(vcAlgorithm == 7) << 7;
    vcTLMask3 = (uint)(3 < vcAlgorithm) << 7;
    vcTLMask2 = (uint)(4 < vcAlgorithm) << 7;
    vcTLMask1 = 0x80;
  }
  else {
    vcTLMask4 = 0;
    vcTLMask3 = 0;
    vcTLMask2 = 0;
    vcTLMask1 = 0;
  }
  if ((target_driver < 3) || (2 < source_driver)) {
    if (((target_driver < 3) && (2 < source_driver)) &&
       (((vcTL1 & 0x80) != 0 ||
        (((((vcTL2 & 0x80) != 0 && (4 < vcAlgorithm)) ||
          (((vcTL3 & 0x80) != 0 && (3 < vcAlgorithm)))) ||
         (((vcTL4 & 0x80) != 0 && (vcAlgorithm == 7)))))))) {
      printf("Warning: Voice 0x%X has TL bits that do not match its algorithm setting. This voice will not work in S1/S2 drivers.\n"
             ,(ulong)current_voice);
    }
  }
  else {
    vcTLMask4 = (uint)(vcAlgorithm == 7) << 7;
    vcTLMask3 = (uint)(3 < vcAlgorithm) << 7;
    vcTLMask2 = (uint)(4 < vcAlgorithm) << 7;
    vcTLMask1 = 0x80;
    vcTL1 = vcTL1 & 0x7f;
    vcTL2 = vcTL2 & 0x7f;
    vcTL3 = vcTL3 & 0x7f;
    vcTL4 = vcTL4 & 0x7f;
  }
  if (target_driver == 2) {
    WriteByte((char)(vcDT4 << 4) + (char)vcCF4);
    WriteByte((char)(vcDT2 << 4) + (char)vcCF2);
    WriteByte((char)(vcDT3 << 4) + (char)vcCF3);
    WriteByte((char)(vcDT1 << 4) + (char)vcCF1);
    WriteByte((char)(vcRS4 << 6) + (char)vcAR4);
    WriteByte((char)(vcRS2 << 6) + (char)vcAR2);
    WriteByte((char)(vcRS3 << 6) + (char)vcAR3);
    WriteByte((char)(vcRS1 << 6) + (char)vcAR1);
    WriteByte((byte)vcAM4 | (byte)vcD1R4 | (byte)vcD1R4Unk);
    WriteByte((byte)vcAM2 | (byte)vcD1R2 | (byte)vcD1R2Unk);
    WriteByte((byte)vcAM3 | (byte)vcD1R3 | (byte)vcD1R3Unk);
    WriteByte((byte)vcAM1 | (byte)vcD1R1 | (byte)vcD1R1Unk);
    WriteByte((uchar)vcD2R4);
    WriteByte((uchar)vcD2R2);
    WriteByte((uchar)vcD2R3);
    WriteByte((uchar)vcD2R1);
    WriteByte((char)(vcDL4 << 4) + (char)vcRR4);
    WriteByte((char)(vcDL2 << 4) + (char)vcRR2);
    WriteByte((char)(vcDL3 << 4) + (char)vcRR3);
    WriteByte((char)(vcDL1 << 4) + (char)vcRR1);
    WriteByte((byte)vcTL4 | (byte)vcTLMask4);
    WriteByte((byte)vcTL2 | (byte)vcTLMask2);
    WriteByte((byte)vcTL3 | (byte)vcTLMask3);
    WriteByte((byte)vcTL1 | (byte)vcTLMask1);
  }
  else {
    WriteByte((char)(vcDT4 << 4) + (char)vcCF4);
    WriteByte((char)(vcDT3 << 4) + (char)vcCF3);
    WriteByte((char)(vcDT2 << 4) + (char)vcCF2);
    WriteByte((char)(vcDT1 << 4) + (char)vcCF1);
    WriteByte((char)(vcRS4 << 6) + (char)vcAR4);
    WriteByte((char)(vcRS3 << 6) + (char)vcAR3);
    WriteByte((char)(vcRS2 << 6) + (char)vcAR2);
    WriteByte((char)(vcRS1 << 6) + (char)vcAR1);
    WriteByte((byte)vcAM4 | (byte)vcD1R4 | (byte)vcD1R4Unk);
    WriteByte((byte)vcAM3 | (byte)vcD1R3 | (byte)vcD1R3Unk);
    WriteByte((byte)vcAM2 | (byte)vcD1R2 | (byte)vcD1R2Unk);
    WriteByte((byte)vcAM1 | (byte)vcD1R1 | (byte)vcD1R1Unk);
    WriteByte((uchar)vcD2R4);
    WriteByte((uchar)vcD2R3);
    WriteByte((uchar)vcD2R2);
    WriteByte((uchar)vcD2R1);
    WriteByte((char)(vcDL4 << 4) + (char)vcRR4);
    WriteByte((char)(vcDL3 << 4) + (char)vcRR3);
    WriteByte((char)(vcDL2 << 4) + (char)vcRR2);
    WriteByte((char)(vcDL1 << 4) + (char)vcRR1);
    WriteByte((byte)vcTL4 | (byte)vcTLMask4);
    WriteByte((byte)vcTL3 | (byte)vcTLMask3);
    WriteByte((byte)vcTL2 | (byte)vcTLMask2);
    WriteByte((byte)vcTL1 | (byte)vcTLMask1);
  }
  current_voice = current_voice + 1;
  return;
}

Assistant:

static void Macro_smpsVcTotalLevel(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	vcTL1 = arg_array[0];
	vcTL2 = arg_array[1];
	vcTL3 = arg_array[2];
	vcTL4 = arg_array[3];

	WriteByte((vcUnusedBits << 6) + (vcFeedback << 3) + vcAlgorithm);

	if (target_smps2asm_version == 0)
	{
		vcTLMask4 = ((vcAlgorithm == 7) << 7);
		vcTLMask3 = ((vcAlgorithm >= 4) << 7);
		vcTLMask2 = ((vcAlgorithm >= 5) << 7);
		vcTLMask1 = 0x80;
	}
	else
	{
		vcTLMask4 = 0;
		vcTLMask3 = 0;
		vcTLMask2 = 0;
		vcTLMask1 = 0;
	}

	if (target_driver >= 3 && source_driver < 3)
	{
		vcTLMask4 = ((vcAlgorithm == 7) << 7);
		vcTLMask3 = ((vcAlgorithm >= 4) << 7);
		vcTLMask2 = ((vcAlgorithm >= 5) << 7);
		vcTLMask1 = 0x80;

		vcTL1 &= 0x7F;
		vcTL2 &= 0x7F;
		vcTL3 &= 0x7F;
		vcTL4 &= 0x7F;
	}
	else if (target_driver < 3 && source_driver >= 3 && ((vcTL1 & 0x80) || (vcTL2 & 0x80 && vcAlgorithm >= 5) || (vcTL3 & 0x80 && vcAlgorithm >= 4) || (vcTL4 & 0x80 && vcAlgorithm == 7)))
	{
		printf("Warning: Voice 0x%X has TL bits that do not match its algorithm setting. This voice will not work in S1/S2 drivers.\n", current_voice);
	}

	if (target_driver == 2)
	{
		WriteByte((vcDT4<<4)+vcCF4);
		WriteByte((vcDT2<<4)+vcCF2);
		WriteByte((vcDT3<<4)+vcCF3);
		WriteByte((vcDT1<<4)+vcCF1);
		WriteByte((vcRS4<<6)+vcAR4);
		WriteByte((vcRS2<<6)+vcAR2);
		WriteByte((vcRS3<<6)+vcAR3);
		WriteByte((vcRS1<<6)+vcAR1);
		WriteByte(vcAM4|vcD1R4|vcD1R4Unk);
		WriteByte(vcAM2|vcD1R2|vcD1R2Unk);
		WriteByte(vcAM3|vcD1R3|vcD1R3Unk);
		WriteByte(vcAM1|vcD1R1|vcD1R1Unk);
		WriteByte(vcD2R4);
		WriteByte(vcD2R2);
		WriteByte(vcD2R3);
		WriteByte(vcD2R1);
		WriteByte((vcDL4<<4)+vcRR4);
		WriteByte((vcDL2<<4)+vcRR2);
		WriteByte((vcDL3<<4)+vcRR3);
		WriteByte((vcDL1<<4)+vcRR1);
		WriteByte(vcTL4|vcTLMask4);
		WriteByte(vcTL2|vcTLMask2);
		WriteByte(vcTL3|vcTLMask3);
		WriteByte(vcTL1|vcTLMask1);
	}
	else
	{
		WriteByte((vcDT4<<4)+vcCF4);
		WriteByte((vcDT3<<4)+vcCF3);
		WriteByte((vcDT2<<4)+vcCF2);
		WriteByte((vcDT1<<4)+vcCF1);
		WriteByte((vcRS4<<6)+vcAR4);
		WriteByte((vcRS3<<6)+vcAR3);
		WriteByte((vcRS2<<6)+vcAR2);
		WriteByte((vcRS1<<6)+vcAR1);
		WriteByte(vcAM4|vcD1R4|vcD1R4Unk);
		WriteByte(vcAM3|vcD1R3|vcD1R3Unk);
		WriteByte(vcAM2|vcD1R2|vcD1R2Unk);
		WriteByte(vcAM1|vcD1R1|vcD1R1Unk);
		WriteByte(vcD2R4);
		WriteByte(vcD2R3);
		WriteByte(vcD2R2);
		WriteByte(vcD2R1);
		WriteByte((vcDL4<<4)+vcRR4);
		WriteByte((vcDL3<<4)+vcRR3);
		WriteByte((vcDL2<<4)+vcRR2);
		WriteByte((vcDL1<<4)+vcRR1);
		WriteByte(vcTL4|vcTLMask4);
		WriteByte(vcTL3|vcTLMask3);
		WriteByte(vcTL2|vcTLMask2);
		WriteByte(vcTL1|vcTLMask1);
	}

	++current_voice;
}